

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

MIR_reg_t get_reload_hreg(gen_ctx_t gen_ctx,MIR_reg_t var,MIR_reg_t type,int out_p)

{
  int iVar1;
  MIR_reg_t MVar2;
  MIR_reg_t MVar3;
  int *local_58;
  insn_reload_t *local_50;
  int local_44;
  int i;
  int *reloads_num;
  int rld_num;
  insn_reload_t *reloads;
  MIR_reg_t hr;
  int out_p_local;
  MIR_reg_t type_local;
  MIR_reg_t var_local;
  gen_ctx_t gen_ctx_local;
  
  if (out_p == 0) {
    local_50 = gen_ctx->ra_ctx->in_reloads;
  }
  else {
    local_50 = gen_ctx->ra_ctx->out_reloads;
  }
  reloads_num._4_4_ = 0;
  if (out_p == 0) {
    local_58 = &gen_ctx->ra_ctx->in_reloads_num;
  }
  else {
    local_58 = &gen_ctx->ra_ctx->out_reloads_num;
  }
  for (local_44 = 0; local_44 < *local_58; local_44 = local_44 + 1) {
    if ((var != 0xffffffff) && (local_50[local_44].var == var)) {
      return local_50[local_44].hreg;
    }
    if ((reloads_num._4_4_ == 0) &&
       (MVar3 = local_50[local_44].hreg, MVar2 = get_temp_hard_reg(type,1), MVar3 == MVar2)) {
      reloads_num._4_4_ = 1;
    }
    else {
      MVar3 = local_50[local_44].hreg;
      MVar2 = get_temp_hard_reg(type,0);
      if (MVar3 == MVar2) {
        reloads_num._4_4_ = 2;
      }
    }
  }
  if (1 < reloads_num._4_4_) {
    __assert_fail("rld_num <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
  }
  MVar3 = get_temp_hard_reg(type,(uint)(reloads_num._4_4_ == 0));
  iVar1 = *local_58;
  *local_58 = iVar1 + 1;
  if (iVar1 < 8) {
    local_50[iVar1].var = var;
    local_50[iVar1].type = type;
    local_50[iVar1].hreg = MVar3;
    return MVar3;
  }
  __assert_fail("rld_num < (2 * 4)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
}

Assistant:

static MIR_reg_t get_reload_hreg (gen_ctx_t gen_ctx, MIR_reg_t var, MIR_reg_t type, int out_p) {
  MIR_reg_t hr;
  insn_reload_t *reloads = out_p ? out_reloads : in_reloads;
  int rld_num = 0, *reloads_num = out_p ? &out_reloads_num : &in_reloads_num;

  for (int i = 0; i < *reloads_num; i++) {
    if (var != MIR_NON_VAR && reloads[i].var == var) return reloads[i].hreg;
    if (rld_num == 0 && reloads[i].hreg == get_temp_hard_reg (type, TRUE))
      rld_num = 1;
    else if (reloads[i].hreg == get_temp_hard_reg (type, FALSE))
      rld_num = 2;
  }
  gen_assert (rld_num <= 1);
  hr = get_temp_hard_reg (type, rld_num == 0);
  rld_num = (*reloads_num)++;
  gen_assert (rld_num < MAX_INSN_RELOADS);
  reloads[rld_num].var = var;
  reloads[rld_num].type = type;
  reloads[rld_num].hreg = hr;
  return hr;
}